

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O3

size_t absl::lts_20240722::container_internal::
       TypeErasedApplyToSlotFn<absl::lts_20240722::hash_internal::Hash<std::vector<int,std::allocator<int>>>,std::vector<int,std::allocator<int>>>
                 (void *fn,void *slot)

{
  undefined1 auVar1 [16];
  MixingHashState MVar2;
  
  MVar2 = hash_internal::MixingHashState::combine_contiguous
                    ((MixingHashState)&hash_internal::MixingHashState::kSeed,*slot,
                     *(long *)((long)slot + 8) - (long)*slot);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = MVar2.state_ + (*(long *)((long)slot + 8) - *slot >> 2);
  return SUB168(auVar1 * ZEXT816(0x9ddfea08eb382d69),0) ^
         SUB168(auVar1 * ZEXT816(0x9ddfea08eb382d69),8);
}

Assistant:

size_t TypeErasedApplyToSlotFn(const void* fn, void* slot) {
  const auto* f = static_cast<const Fn*>(fn);
  return (*f)(*static_cast<const T*>(slot));
}